

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Minisat::Int64Option::fillGranularityDomain
          (Int64Option *this,int granularity,vector<long,_std::allocator<long>_> *values)

{
  reference pvVar1;
  size_type *psVar2;
  long lVar3;
  vector<long,_std::allocator<long>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  int j;
  int64_t dist;
  int addedValues;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff90;
  value_type vVar4;
  size_type in_stack_ffffffffffffffa8;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffb0;
  int local_44;
  int local_30;
  int local_2c;
  long local_28;
  int local_1c;
  
  std::vector<long,_std::allocator<long>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  vVar4 = *(value_type *)(in_RDI + 0x40);
  local_1c = 1;
  pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,0);
  *pvVar1 = vVar4;
  if (*(long *)(in_RDI + 0x40) < 0x10) {
    local_44 = 1;
  }
  else {
    local_44 = 0x200;
    if (*(long *)(in_RDI + 0x40) < 16000) {
      local_44 = 0x40;
    }
  }
  lVar3 = (long)local_44;
  if (1 < in_ESI) {
    in_stack_ffffffffffffffb0 = *(vector<long,_std::allocator<long>_> **)(in_RDI + 0x48);
    local_1c = 2;
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,1);
    *pvVar1 = (value_type)in_stack_ffffffffffffffb0;
  }
  do {
    local_28 = lVar3;
    if (in_ESI <= local_1c) break;
    if ((*(long *)(in_RDI + 0x40) < *(long *)(in_RDI + 0x40) + local_28) &&
       (*(long *)(in_RDI + 0x40) + local_28 <= *(long *)(in_RDI + 0x38))) {
      in_stack_ffffffffffffffa8 = *(long *)(in_RDI + 0x40) + local_28;
      psVar2 = (size_type *)
               std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_1c);
      *psVar2 = in_stack_ffffffffffffffa8;
      local_1c = local_1c + 1;
    }
    if ((local_1c < in_ESI) && (*(long *)(in_RDI + 0x30) <= *(long *)(in_RDI + 0x40) - local_28)) {
      lVar3 = *(long *)(in_RDI + 0x40);
      pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_1c);
      *pvVar1 = lVar3 - local_28;
      local_1c = local_1c + 1;
    }
    lVar3 = local_28 * 4;
  } while (((*(long *)(in_RDI + 0x40) <= *(long *)(in_RDI + 0x40) + local_28 * -4) ||
           (*(long *)(in_RDI + 0x40) + lVar3 <= *(long *)(in_RDI + 0x38))) ||
          (*(long *)(in_RDI + 0x30) <= *(long *)(in_RDI + 0x40) + local_28 * -4));
  std::vector<long,_std::allocator<long>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sort<long>(in_stack_ffffffffffffff90);
  local_2c = 0;
  for (local_30 = 1; local_30 < local_1c; local_30 = local_30 + 1) {
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_30);
    lVar3 = *pvVar1;
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_2c);
    if (lVar3 != *pvVar1) {
      pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_30);
      vVar4 = *pvVar1;
      local_2c = local_2c + 1;
      pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDX,(long)local_2c);
      *pvVar1 = vVar4;
    }
  }
  std::vector<long,_std::allocator<long>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void fillGranularityDomain(int granularity, std::vector<int64_t> &values)
    {
        values.resize(granularity);
        int addedValues = 0;
        values[addedValues++] = value;
        int64_t dist = value < 16 ? 1 : (value < 16000 ? 64 : 512); // smarter way to initialize the initial diff value
        if (addedValues < granularity) {
            values[addedValues++] = defaultValue;
        }
        while (addedValues < granularity) {
            if (value + dist > value && value + dist <= range.end) {
                values[addedValues++] = value + dist;
            }
            if (addedValues < granularity && value - dist >= range.begin) {
                values[addedValues++] = value - dist;
            }
            dist = dist * 4;
            if (value - dist < value && value + dist > range.end && value - dist < range.begin) {
                break;
            } // stop if there cannot be more values!
        }
        values.resize(addedValues);
        sort(values);
        int j = 0;
        assert(values[0] >= range.begin && values[0] <= range.end && "stay in bound");
        for (int i = 1; i < addedValues; ++i) {
            if (values[i] != values[j]) {
                assert(values[i] >= range.begin && values[i] <= range.end && "stay in bound");
                values[++j] = values[i];
            }
        }
        j++;
        assert(addedValues > 0 && "there has to be at least one option");
        assert(j <= addedValues && j <= granularity && "collected values hae to stay in bounds");
        values.resize(j);
    }